

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O3

string * readNumber_abi_cxx11_(void)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)in_RDI);
  while( true ) {
    bVar1 = isValidNumber(in_RDI);
    if (bVar1) break;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(in_RDI->_M_dataplus)._M_p,in_RDI->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is not a valid number.\n",0x18);
    std::operator>>((istream *)&std::cin,(string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string readNumber()
{
	std::string input{};
	std::cin >> input;
	while (!isValidNumber(input))
	{
		std::cerr << input << " is not a valid number.\n";
		std::cin >> input;
	}
	return input;
}